

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

aiTextureMapMode ConvertWrappingMode(SamplerWrap gltfWrapMode)

{
  SamplerWrap gltfWrapMode_local;
  
  if ((gltfWrapMode != UNSET) && (gltfWrapMode != Repeat)) {
    if (gltfWrapMode == Clamp_To_Edge) {
      return aiTextureMapMode_Clamp;
    }
    if (gltfWrapMode == Mirrored_Repeat) {
      return aiTextureMapMode_Mirror;
    }
  }
  return aiTextureMapMode_Wrap;
}

Assistant:

static aiTextureMapMode ConvertWrappingMode(SamplerWrap gltfWrapMode)
{
    switch (gltfWrapMode) {
        case SamplerWrap::Mirrored_Repeat:
            return aiTextureMapMode_Mirror;

        case SamplerWrap::Clamp_To_Edge:
            return aiTextureMapMode_Clamp;

        case SamplerWrap::UNSET:
        case SamplerWrap::Repeat:
        default:
            return aiTextureMapMode_Wrap;
    }
}